

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O1

void __thiscall
cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::
process<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_char&,unsigned_short&,unsigned_char&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
          (InputArchive<cereal::PortableBinaryInputArchive,1u> *this,unsigned_short *head,
          unsigned_short *tail,unsigned_short *tail_1,unsigned_short *tail_2,uchar *tail_3,
          unsigned_short *tail_4,uchar *tail_5,unsigned_short *tail_6,unsigned_short *tail_7,
          unsigned_short *tail_8,unsigned_short *tail_9)

{
  PortableBinaryInputArchive::loadBinary<2ul>
            (*(PortableBinaryInputArchive **)(*(long *)(this + 8) + 8),head,2);
  PortableBinaryInputArchive::loadBinary<2ul>
            (*(PortableBinaryInputArchive **)(*(long *)(this + 8) + 8),tail,2);
  PortableBinaryInputArchive::loadBinary<2ul>
            (*(PortableBinaryInputArchive **)(*(long *)(this + 8) + 8),tail_1,2);
  PortableBinaryInputArchive::loadBinary<2ul>
            (*(PortableBinaryInputArchive **)(*(long *)(this + 8) + 8),tail_2,2);
  PortableBinaryInputArchive::loadBinary<1ul>
            (*(PortableBinaryInputArchive **)(*(long *)(this + 8) + 8),tail_3,1);
  PortableBinaryInputArchive::loadBinary<2ul>
            (*(PortableBinaryInputArchive **)(*(long *)(this + 8) + 8),tail_4,2);
  PortableBinaryInputArchive::loadBinary<1ul>
            (*(PortableBinaryInputArchive **)(*(long *)(this + 8) + 8),tail_5,1);
  PortableBinaryInputArchive::loadBinary<2ul>
            (*(PortableBinaryInputArchive **)(*(long *)(this + 8) + 8),tail_6,2);
  PortableBinaryInputArchive::loadBinary<2ul>
            (*(PortableBinaryInputArchive **)(*(long *)(this + 8) + 8),tail_7,2);
  PortableBinaryInputArchive::loadBinary<2ul>
            (*(PortableBinaryInputArchive **)(*(long *)(this + 8) + 8),tail_8,2);
  PortableBinaryInputArchive::loadBinary<2ul>
            (*(PortableBinaryInputArchive **)(*(long *)(this + 8) + 8),tail_9,2);
  return;
}

Assistant:

inline
      void process( T && head, Other && ... tail )
      {
        process( std::forward<T>( head ) );
        process( std::forward<Other>( tail )... );
      }